

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O2

void __thiscall
Saturation::SaturationAlgorithm::onClauseReduction
          (SaturationAlgorithm *this,Clause *cl,Clause **replacements,uint numOfReplacements,
          ClauseIterator *premises,bool forward)

{
  Splitter *this_00;
  Clause *pCVar1;
  SaturationAlgorithm *this_01;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  Clause **ppCVar5;
  long lVar6;
  Iterator it;
  VirtualIterator<Kernel::Clause_*> local_70;
  Clause *local_68;
  ClauseIterator local_60;
  SaturationAlgorithm *local_58;
  string local_50;
  
  local_58 = this;
  if ((onClauseReduction(Kernel::Clause*,Kernel::Clause**,unsigned_int,Lib::VirtualIterator<Kernel::Clause*>,bool)
       ::premStack == '\0') &&
     (iVar2 = __cxa_guard_acquire(&onClauseReduction(Kernel::Clause*,Kernel::Clause**,unsigned_int,Lib::VirtualIterator<Kernel::Clause*>,bool)
                                   ::premStack), iVar2 != 0)) {
    onClauseReduction::premStack._cursor = (Clause **)0x0;
    onClauseReduction::premStack._end = (Clause **)0x0;
    onClauseReduction::premStack._capacity = 0;
    onClauseReduction::premStack._stack = (Clause **)0x0;
    __cxa_atexit(Lib::Stack<Kernel::Clause_*>::~Stack,&onClauseReduction::premStack,&__dso_handle);
    __cxa_guard_release(&onClauseReduction(Kernel::Clause*,Kernel::Clause**,unsigned_int,Lib::VirtualIterator<Kernel::Clause*>,bool)
                         ::premStack);
  }
  onClauseReduction::premStack._cursor = onClauseReduction::premStack._stack;
  local_70._core = premises->_core;
  if (local_70._core != (IteratorCore<Kernel::Clause_*> *)0x0) {
    (local_70._core)->_refCnt = (local_70._core)->_refCnt + 1;
  }
  Lib::Stack<Kernel::Clause*>::loadFromIterator<Lib::VirtualIterator<Kernel::Clause*>>
            ((Stack<Kernel::Clause*> *)&onClauseReduction::premStack,&local_70);
  Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator(&local_70);
  if (numOfReplacements == 0) {
    local_68 = (Clause *)0x0;
  }
  else {
    local_68 = *replacements;
  }
  if ((*(char *)(Lib::env + 0x913a) != '\0') || ((*(byte *)(Lib::env + 0xa0fa) & 1) != 0)) {
    poVar3 = std::operator<<((ostream *)&std::cout,"[SA] ");
    pcVar4 = "backward";
    if (forward) {
      pcVar4 = "forward";
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3," reduce: ");
    Kernel::Clause::toString_abi_cxx11_(&local_50,cl);
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_50);
    for (lVar6 = 0; numOfReplacements != (uint)lVar6; lVar6 = lVar6 + 1) {
      pCVar1 = replacements[lVar6];
      if (pCVar1 != (Clause *)0x0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"      replaced by ");
        Kernel::Clause::toString_abi_cxx11_(&local_50,pCVar1);
        poVar3 = std::operator<<(poVar3,(string *)&local_50);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    ppCVar5 = onClauseReduction::premStack._cursor;
    while (ppCVar5 != onClauseReduction::premStack._stack) {
      pCVar1 = ppCVar5[-1];
      ppCVar5 = ppCVar5 + -1;
      if (pCVar1 != (Clause *)0x0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"     using ");
        Kernel::Clause::toString_abi_cxx11_(&local_50,pCVar1);
        poVar3 = std::operator<<(poVar3,(string *)&local_50);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
  }
  this_01 = local_58;
  pCVar1 = local_68;
  this_00 = local_58->_splitter;
  if (this_00 != (Splitter *)0x0) {
    it.super_RefIterator._stack = (Stack<Kernel::Clause_*> *)onClauseReduction::premStack._cursor;
    it.super_RefIterator._pointer = (Clause **)&local_60;
    Lib::pvi<Lib::Stack<Kernel::Clause*>::Iterator>(it);
    Splitter::onClauseReduction(this_00,cl,&local_60,pCVar1);
    Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator(&local_60);
  }
  if (pCVar1 != (Clause *)0x0) {
    while (onParenthood(this_01,pCVar1,cl),
          onClauseReduction::premStack._cursor != onClauseReduction::premStack._stack) {
      cl = onClauseReduction::premStack._cursor[-1];
      onClauseReduction::premStack._cursor = onClauseReduction::premStack._cursor + -1;
    }
  }
  return;
}

Assistant:

void SaturationAlgorithm::onClauseReduction(Clause* cl, Clause **replacements, unsigned numOfReplacements,
                                            ClauseIterator premises, bool forward)
{
  ASS(cl);

  static ClauseStack premStack;
  premStack.reset();
  premStack.loadFromIterator(premises);

  Clause *replacement = numOfReplacements ? *replacements : 0;

  if (env.options->showReductions()) {
    std::cout << "[SA] " << (forward ? "forward" : "backward") << " reduce: " << cl->toString() << endl;
    for(unsigned i = 0; i < numOfReplacements; i++){
      Clause* replacement = *replacements;
      if(replacement){ std::cout << "      replaced by " << replacement->toString() << endl; }
      replacements++;
    }
    ClauseStack::Iterator pit(premStack);
    while(pit.hasNext()){
      Clause* premise = pit.next();
      if(premise){ std::cout << "     using " << premise->toString() << endl; }
    }
  }

  if (_splitter) {
    _splitter->onClauseReduction(cl, pvi(ClauseStack::Iterator(premStack)), replacement);
  }

  if (replacement) {
    // Where an inference has multiple conclusions, onParenthood will only be run
    // for the final conclusion. This is unsafe when running with symbol elimination.
    // At the moment the only simplification rules that have multiple conclusions
    // are higher-order and it is assumed that we will not run higher-order along
    // with symbol elimination.
    // In the future if a first-order simplification rule is added with multiple
    // conclusions, this code should be updated.
    onParenthood(replacement, cl);
    while (premStack.isNonEmpty()) {
      onParenthood(replacement, premStack.pop());
    }
  }
}